

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosaraju_scc.cpp
# Opt level: O0

void __thiscall
KosarajuSCC::topological_sort
          (KosarajuSCC *this,int u,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *out,vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *ends,queue<int,_std::deque<int,_std::allocator<int>_>_> *sort,
          vector<bool,_std::allocator<bool>_> *seen)

{
  bool bVar1;
  queue<int,_std::deque<int,_std::allocator<int>_>_> *this_00;
  reference pvVar2;
  queue<int,_std::deque<int,_std::allocator<int>_>_> *pqVar3;
  reference pvVar4;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_RCX;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_RDX;
  int in_ESI;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_R8;
  queue<int,_std::deque<int,_std::allocator<int>_>_> *in_R9;
  reference rVar5;
  int v;
  int e;
  uint i;
  value_type *in_stack_ffffffffffffff88;
  reference in_stack_ffffffffffffffa0;
  size_type __n;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint local_44;
  undefined4 in_stack_fffffffffffffff0;
  
  rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    ((vector<bool,_std::allocator<bool>_> *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa0._M_mask);
  std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffffc0,true);
  local_44 = 0;
  while( true ) {
    __n = in_stack_ffffffffffffffa0._M_mask;
    this_00 = (queue<int,_std::deque<int,_std::allocator<int>_>_> *)(ulong)local_44;
    pvVar2 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](in_RDX,(long)in_ESI);
    pqVar3 = (queue<int,_std::deque<int,_std::allocator<int>_>_> *)
             std::vector<int,_std::allocator<int>_>::size(pvVar2);
    if (pqVar3 <= this_00) break;
    pvVar2 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](in_RDX,(long)in_ESI);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(ulong)local_44);
    pvVar2 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](in_RCX,(long)*pvVar4);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,1);
    in_stack_ffffffffffffffa0 =
         std::vector<bool,_std::allocator<bool>_>::operator[]
                   ((vector<bool,_std::allocator<bool>_> *)
                    CONCAT44(*pvVar4,in_stack_ffffffffffffffb0),__n);
    bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffffa0);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      topological_sort((KosarajuSCC *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                       (int)((ulong)in_RDX >> 0x20),in_RCX,in_R8,in_R9,
                       (vector<bool,_std::allocator<bool>_> *)rVar5._M_mask);
    }
    local_44 = local_44 + 1;
  }
  std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push(this_00,in_stack_ffffffffffffff88);
  return;
}

Assistant:

void KosarajuSCC::topological_sort(int u, std::vector<std::vector<int> >& out,
																	 std::vector<std::vector<int> >& ends, std::queue<int>& sort,
																	 std::vector<bool>& seen) {
	seen[u] = true;
	for (unsigned int i = 0; i < out[u].size(); ++i) {
		const int e = out[u][i];
		const int v = ends[e][1];
		if (!seen[v]) {
			topological_sort(v, out, ends, sort, seen);
		}
	}
	sort.push(u);
}